

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool units::clearEmptySegments(string *unit)

{
  size_type sVar1;
  long lVar2;
  value_type *seg;
  bool bVar3;
  
  lVar2 = 0;
  bVar3 = false;
LAB_0034ca36:
  if (lVar2 == 0x80) {
    return bVar3;
  }
  sVar1 = 0;
  do {
    sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&Esegs_abi_cxx11_ + lVar2),sVar1);
    while( true ) {
      if (sVar1 == 0xffffffffffffffff) {
        lVar2 = lVar2 + 0x20;
        goto LAB_0034ca36;
      }
      if ((sVar1 != 0) && ((unit->_M_dataplus)._M_p[sVar1 - 1] == '\\')) break;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,sVar1,
                 *(size_type *)(&DAT_004fd668 + lVar2));
      sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&Esegs_abi_cxx11_ + lVar2),sVar1 + 1);
      bVar3 = true;
    }
    sVar1 = sVar1 + 2;
  } while( true );
}

Assistant:

bool clearEmptySegments(std::string& unit)
{
    bool changed = false;
    for (const auto& seg : Esegs) {
        auto fnd = unit.find(seg);
        while (fnd != std::string::npos) {
            if (fnd > 0 && unit[fnd - 1] == '\\') {
                fnd = unit.find(seg, fnd + 2);
                continue;
            }
            unit.erase(fnd, seg.size());
            changed = true;
            fnd = unit.find(seg, fnd + 1);
        }
    }
    return changed;
}